

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O2

void dumpSetup(Setup *s)

{
  char *__s;
  int i;
  long lVar1;
  
  printf("PC: %04x  Opcode: %04x  ",(ulong)s->pc,(ulong)s->opcode);
  printf("Ext1: %04x  Ext2: %04x  Ext3: %04x ",(ulong)s->ext1,(ulong)s->ext2,(ulong)s->ext3);
  __s = "";
  if (s->supervisor != false) {
    __s = "(SUPERVISOR MODE)";
  }
  puts(__s);
  printf("         ");
  printf("CCR: %02x  ",(ulong)s->ccr);
  printf("VBR: %02x  ",(ulong)s->vbr);
  printf("SFC: %02x  ",(ulong)s->sfc);
  printf("DFC: %02x  ",(ulong)s->dfc);
  printf("CACR: %02x ",(ulong)s->cacr);
  printf("CAAR: %02x\n",(ulong)s->caar);
  printf("         ");
  printf("Dn: ");
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    printf("%8x ",(ulong)s->d[lVar1]);
  }
  putchar(10);
  printf("         ");
  printf("An: ");
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    printf("%8x ",(ulong)s->a[lVar1]);
  }
  puts("\n");
  return;
}

Assistant:

void dumpSetup(Setup &s)
{
    printf("PC: %04x  Opcode: %04x  ", s.pc, s.opcode);
    printf("Ext1: %04x  Ext2: %04x  Ext3: %04x ", s.ext1, s.ext2, s.ext3);
    printf("%s\n", s.supervisor ? "(SUPERVISOR MODE)" : "");
    printf("         ");
    printf("CCR: %02x  ", s.ccr);
    printf("VBR: %02x  ", s.vbr);
    printf("SFC: %02x  ", s.sfc);
    printf("DFC: %02x  ", s.dfc);
    printf("CACR: %02x ", s.cacr);
    printf("CAAR: %02x\n", s.caar);
    printf("         ");
    printf("Dn: ");
    for (int i = 0; i < 8; i++) printf("%8x ", s.d[i]);
    printf("\n");
    printf("         ");
    printf("An: ");
    for (int i = 0; i < 8; i++) printf("%8x ", s.a[i]);
    printf("\n\n");
}